

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStorage.cpp
# Opt level: O0

void __thiscall
OpenMD::DataStorage::internalResize<double>
          (DataStorage *this,vector<double,_std::allocator<double>_> *v,size_t newSize)

{
  size_type sVar1;
  iterator this_00;
  ulong in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  iterator i;
  size_t oldSize;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff78;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
  *in_stack_ffffffffffffff80;
  unsigned_long in_stack_ffffffffffffff98;
  const_iterator in_stack_ffffffffffffffa0;
  const_iterator in_stack_ffffffffffffffa8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffb0;
  const_iterator in_stack_ffffffffffffffb8;
  
  sVar1 = std::vector<double,_std::allocator<double>_>::size(in_RSI);
  if (sVar1 != in_RDX) {
    if (sVar1 < in_RDX) {
      std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff78);
      __gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>::
      __normal_iterator<double*>
                (in_stack_ffffffffffffff80,
                 (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                 in_stack_ffffffffffffff78);
      std::vector<double,_std::allocator<double>_>::insert
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffb8,
                 (size_type)in_stack_ffffffffffffffa8._M_current,
                 in_stack_ffffffffffffffa0._M_current);
    }
    else {
      __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
      __normal_iterator((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                         *)&stack0xffffffffffffffb8);
      std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff78);
      std::
      advance<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,unsigned_long>
                ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                 in_stack_ffffffffffffffa0._M_current,in_stack_ffffffffffffff98);
      __gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>::
      __normal_iterator<double*>
                ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> *
                 )in_RSI,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                          *)in_stack_ffffffffffffff78);
      this_00 = std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff78);
      __gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>::
      __normal_iterator<double*>
                ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> *
                 )in_RSI,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                          *)in_stack_ffffffffffffff78);
      std::vector<double,_std::allocator<double>_>::erase
                ((vector<double,_std::allocator<double>_> *)this_00._M_current,
                 in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    }
  }
  return;
}

Assistant:

void DataStorage::internalResize(std::vector<T>& v, std::size_t newSize) {
    std::size_t oldSize = v.size();

    if (oldSize == newSize) {
      return;
    } else if (oldSize < newSize) {
      v.insert(v.end(), newSize - oldSize, T());
    } else {
      typename std::vector<T>::iterator i;
      i = v.begin();
      std::advance(i, newSize);
      v.erase(i, v.end());
    }
  }